

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  int a;
  int b;
  undefined8 *puVar2;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar3;
  uint uVar4;
  int iVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  stbi_uc *psVar11;
  byte *pbVar12;
  void *pvVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  
  s = z->s;
  uVar4 = stbi__get16be(s);
  if (uVar4 < 0xb) {
LAB_0015ce13:
    pcVar10 = "Corrupt JPEG";
  }
  else {
    psVar11 = s->img_buffer;
    if (psVar11 < s->img_buffer_end) {
LAB_0015ce8f:
      s->img_buffer = psVar11 + 1;
      if (*psVar11 == '\b') {
        sVar6 = stbi__get16be(s);
        s->img_y = sVar6;
        if (sVar6 == 0) {
          pcVar10 = "JPEG format not supported: delayed height";
          goto LAB_0015cf19;
        }
        sVar6 = stbi__get16be(s);
        s->img_x = sVar6;
        if (sVar6 == 0) goto LAB_0015ce13;
        pbVar12 = s->img_buffer;
        if (pbVar12 < s->img_buffer_end) {
LAB_0015cf61:
          s->img_buffer = pbVar12 + 1;
          bVar3 = *pbVar12;
        }
        else {
          if (s->read_from_callbacks != 0) {
            psVar11 = s->buffer_start;
            iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
            if (iVar5 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar11;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar11;
              s->img_buffer_end = psVar11 + iVar5;
            }
            pbVar12 = s->img_buffer;
            goto LAB_0015cf61;
          }
          bVar3 = 0;
        }
        if ((bVar3 < 5) && ((0x1aU >> (bVar3 & 0x1f) & 1) != 0)) {
          s->img_n = (uint)bVar3;
          if (bVar3 != 0) {
            lVar15 = 0;
            do {
              *(undefined8 *)((long)&z->img_comp[0].data + lVar15) = 0;
              *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar15) = 0;
              lVar15 = lVar15 + 0x60;
            } while ((ulong)bVar3 * 0x60 != lVar15);
          }
          if (uVar4 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
            z->rgb = 0;
            uVar19 = (ulong)(uint)s->img_n;
            if (0 < s->img_n) {
              psVar11 = s->buffer_start;
              psVar1 = s->buffer_start + 1;
              piVar18 = &z->img_comp[0].tq;
              lVar15 = 0;
              do {
                pbVar12 = s->img_buffer;
                if (pbVar12 < s->img_buffer_end) {
LAB_0015d05f:
                  s->img_buffer = pbVar12 + 1;
                  bVar3 = *pbVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                    if (iVar5 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar11 + iVar5;
                    }
                    pbVar12 = s->img_buffer;
                    goto LAB_0015d05f;
                  }
                  bVar3 = 0;
                }
                ((anon_struct_96_18_0d0905d3 *)(piVar18 + -3))->id = (uint)bVar3;
                if ((s->img_n == 3) && (bVar3 == "RGB"[lVar15])) {
                  z->rgb = z->rgb + 1;
                }
                pbVar12 = s->img_buffer;
                if (pbVar12 < s->img_buffer_end) {
LAB_0015d0fb:
                  s->img_buffer = pbVar12 + 1;
                  bVar3 = *pbVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                    if (iVar5 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar11 + iVar5;
                    }
                    pbVar12 = s->img_buffer;
                    goto LAB_0015d0fb;
                  }
                  bVar3 = 0;
                }
                piVar18[-2] = (uint)(bVar3 >> 4);
                if (((byte)(bVar3 + 0xb0) < 0xc0) ||
                   (piVar18[-1] = bVar3 & 0xf, (bVar3 & 0xf) - 5 < 0xfffffffc)) goto LAB_0015ce13;
                pbVar12 = s->img_buffer;
                if (pbVar12 < s->img_buffer_end) {
LAB_0015d1a2:
                  s->img_buffer = pbVar12 + 1;
                  bVar3 = *pbVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                    if (iVar5 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar11 + iVar5;
                    }
                    pbVar12 = s->img_buffer;
                    goto LAB_0015d1a2;
                  }
                  bVar3 = 0;
                }
                *piVar18 = (uint)bVar3;
                if (3 < bVar3) goto LAB_0015ce13;
                lVar15 = lVar15 + 1;
                uVar19 = (ulong)s->img_n;
                piVar18 = piVar18 + 0x18;
              } while (lVar15 < (long)uVar19);
            }
            if (scan != 0) {
              return 1;
            }
            sVar6 = s->img_x;
            b_00 = s->img_y;
            iVar9 = (int)uVar19;
            iVar5 = stbi__mad3sizes_valid(sVar6,b_00,iVar9,0);
            if (iVar5 == 0) {
              *(char **)(in_FS_OFFSET + -0x10) = "Image too large to decode";
              return 0;
            }
            uVar4 = 1;
            uVar16 = 1;
            if (0 < iVar9) {
              uVar16 = 1;
              lVar15 = 0;
              uVar4 = 1;
              do {
                uVar7 = *(uint *)((long)&z->img_comp[0].h + lVar15);
                uVar8 = *(uint *)((long)&z->img_comp[0].v + lVar15);
                if ((int)uVar4 < (int)uVar7) {
                  uVar4 = uVar7;
                }
                if ((int)uVar16 < (int)uVar8) {
                  uVar16 = (ulong)uVar8;
                }
                lVar15 = lVar15 + 0x60;
              } while ((uVar19 & 0xffffffff) * 0x60 != lVar15);
            }
            z->img_h_max = uVar4;
            iVar5 = (int)uVar16;
            z->img_v_max = iVar5;
            z->img_mcu_w = uVar4 * 8;
            z->img_mcu_h = iVar5 * 8;
            uVar7 = ((sVar6 + uVar4 * 8) - 1) / (uVar4 * 8);
            z->img_mcu_x = uVar7;
            uVar8 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
            z->img_mcu_y = uVar8;
            if (iVar9 < 1) {
              return 1;
            }
            iVar9 = 1;
            lVar15 = 0;
            while( true ) {
              iVar17 = *(int *)((long)&z->img_comp[0].h + lVar15);
              iVar14 = *(int *)((long)&z->img_comp[0].v + lVar15);
              *(uint *)((long)&z->img_comp[0].x + lVar15) = (iVar17 * sVar6 + (uVar4 - 1)) / uVar4;
              *(int *)((long)&z->img_comp[0].y + lVar15) =
                   (int)((iVar14 * b_00 + iVar5 + -1) / uVar16);
              iVar17 = iVar17 * uVar7;
              a = iVar17 * 8;
              *(int *)((long)&z->img_comp[0].w2 + lVar15) = a;
              iVar14 = iVar14 * uVar8;
              b = iVar14 * 8;
              *(int *)((long)&z->img_comp[0].h2 + lVar15) = b;
              pvVar13 = stbi__malloc_mad2(a,b,0xf);
              puVar2 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar15);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)&z->img_comp[0].coeff + lVar15) = 0;
              *(void **)((long)&z->img_comp[0].raw_data + lVar15) = pvVar13;
              why = extraout_EDX;
              if (pvVar13 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].data + lVar15) =
                   (long)pvVar13 + 0xfU & 0xfffffffffffffff0;
              if (z->progressive != 0) {
                *(int *)((long)&z->img_comp[0].coeff_w + lVar15) = iVar17;
                *(int *)((long)&z->img_comp[0].coeff_h + lVar15) = iVar14;
                pvVar13 = stbi__malloc_mad3(a,b,2,0xf);
                *(void **)((long)&z->img_comp[0].raw_coeff + lVar15) = pvVar13;
                why = extraout_EDX_00;
                if (pvVar13 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].coeff + lVar15) =
                     (long)pvVar13 + 0xfU & 0xfffffffffffffff0;
              }
              iVar9 = iVar9 + 1;
              lVar15 = lVar15 + 0x60;
              if ((uVar19 & 0xffffffff) * 0x60 == lVar15) {
                return 1;
              }
            }
            *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
            stbi__free_jpeg_components(z,iVar9,why);
            return 0;
          }
        }
        goto LAB_0015ce13;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      psVar11 = s->img_buffer;
      goto LAB_0015ce8f;
    }
    pcVar10 = "JPEG format not supported: 8-bit only";
  }
LAB_0015cf19:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar10;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}